

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void __thiscall RtApi::clearStreamInfo(RtApi *this)

{
  undefined8 *puVar1;
  long lVar2;
  _func_int **pp_Var3;
  long lVar4;
  long lVar5;
  
  (this->stream_).mode = UNINITIALIZED;
  (this->stream_).state = STREAM_CLOSED;
  (this->stream_).sampleRate = 0;
  (this->stream_).bufferSize = 0;
  (this->stream_).nBuffers = 0;
  (this->stream_).userFormat = 0;
  (this->stream_).userInterleaved = true;
  (this->stream_).streamTime = 0.0;
  (this->stream_).apiHandle = (void *)0x0;
  (this->stream_).deviceBuffer = (char *)0x0;
  (this->stream_).callbackInfo.isRunning = false;
  (this->stream_).callbackInfo.deviceDisconnected = false;
  (this->stream_).callbackInfo.callback = (void *)0x0;
  (this->stream_).callbackInfo.userData = (void *)0x0;
  lVar4 = 0x62;
  lVar5 = 0x21d;
  do {
    *(undefined4 *)((long)this + lVar5 * 4 + -0x68c) = 0x2b67;
    *(undefined1 *)((long)this + lVar5 + -5) = 0;
    *(undefined1 *)((long)this + lVar5 + -2) = 1;
    *(undefined1 *)((long)&this->_vptr_RtApi + lVar5) = 0;
    *(undefined4 *)((long)this + lVar5 * 4 + -0x648) = 0;
    *(undefined4 *)((long)this + lVar5 * 4 + -0x640) = 0;
    *(undefined4 *)((long)this + lVar5 * 4 + -0x638) = 0;
    *(undefined8 *)((long)this + lVar5 * 8 + -0xe88) = 0;
    *(undefined8 *)((long)this + lVar5 * 8 + -0xea0) = 0;
    *(undefined8 *)((long)this + lVar5 * 8 + -0xee8) = 0;
    *(undefined8 *)((long)this + lVar4 * 8 + -0x40) = 0;
    *(undefined4 *)((long)this + lVar4 * 8 + -0x38) = 0;
    puVar1 = (undefined8 *)((long)this + lVar4 * 8 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = *(long *)((long)this + lVar4 * 8 + -0x20);
    if (*(long *)((long)this + lVar4 * 8 + -0x18) != lVar2) {
      *(long *)((long)this + lVar4 * 8 + -0x18) = lVar2;
    }
    pp_Var3 = *(_func_int ***)((long)this + lVar4 * 8 + -8);
    if ((&this->_vptr_RtApi)[lVar4] != pp_Var3) {
      (&this->_vptr_RtApi)[lVar4] = pp_Var3;
    }
    lVar4 = lVar4 + 10;
    lVar5 = lVar5 + 1;
  } while (lVar4 == 0x6c);
  return;
}

Assistant:

void RtApi :: clearStreamInfo()
{
  stream_.mode = UNINITIALIZED;
  stream_.state = STREAM_CLOSED;
  stream_.sampleRate = 0;
  stream_.bufferSize = 0;
  stream_.nBuffers = 0;
  stream_.userFormat = 0;
  stream_.userInterleaved = true;
  stream_.streamTime = 0.0;
  stream_.apiHandle = 0;
  stream_.deviceBuffer = 0;
  stream_.callbackInfo.callback = 0;
  stream_.callbackInfo.userData = 0;
  stream_.callbackInfo.isRunning = false;
  stream_.callbackInfo.deviceDisconnected = false;
  for ( int i=0; i<2; i++ ) {
    stream_.deviceId[i] = 11111;
    stream_.doConvertBuffer[i] = false;
    stream_.deviceInterleaved[i] = true;
    stream_.doByteSwap[i] = false;
    stream_.nUserChannels[i] = 0;
    stream_.nDeviceChannels[i] = 0;
    stream_.channelOffset[i] = 0;
    stream_.deviceFormat[i] = 0;
    stream_.latency[i] = 0;
    stream_.userBuffer[i] = 0;
    stream_.convertInfo[i].channels = 0;
    stream_.convertInfo[i].inJump = 0;
    stream_.convertInfo[i].outJump = 0;
    stream_.convertInfo[i].inFormat = 0;
    stream_.convertInfo[i].outFormat = 0;
    stream_.convertInfo[i].inOffset.clear();
    stream_.convertInfo[i].outOffset.clear();
  }
}